

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::GrowIndex(ImFont *this,int new_size)

{
  int in_ESI;
  float *in_RDI;
  int in_stack_ffffffffffffffec;
  undefined4 uVar1;
  
  if ((int)in_RDI[6] < in_ESI) {
    uVar1 = 0xbf800000;
    ImVector<float>::resize
              ((ImVector<float> *)CONCAT44(in_ESI,0xbf800000),in_stack_ffffffffffffffec,in_RDI);
    ImVector<unsigned_short>::resize
              ((ImVector<unsigned_short> *)CONCAT44(in_ESI,uVar1),
               CONCAT22(0xffff,(short)in_stack_ffffffffffffffec),(unsigned_short *)in_RDI);
  }
  return;
}

Assistant:

void ImFont::GrowIndex(int new_size)
{
    IM_ASSERT(IndexAdvanceX.Size == IndexLookup.Size);
    if (new_size <= IndexLookup.Size)
        return;
    IndexAdvanceX.resize(new_size, -1.0f);
    IndexLookup.resize(new_size, (ImWchar)-1);
}